

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

void __thiscall
Matrix<double,_-1,_-1>::SetElement(Matrix<double,__1,__1> *this,int row,int col,double num)

{
  ostream *poVar1;
  
  if (((-1 < row) && (-1 < col)) && (row < this->rows)) {
    if (col < this->cols) {
      this->data[(uint)(this->cols * row + col)] = num;
      return;
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Assertion occurred! Please check!");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(-1);
}

Assistant:

void Matrix<Type, _0, _1>::SetElement(const int row, const int col, const Type num) const
{
    if(row < 0 || row >= this->row() ||
       col < 0 || col >= this->col())
    {
        cerr << "Assertion occurred! Please check!" << endl;
        exit(-1);
    }
    int position = row * this->cols + col;
    this->data[position] = num;
}